

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments)

{
  int iVar1;
  Location *pLVar2;
  Arena *this_00;
  uint uVar3;
  int iVar4;
  LogMessage *pLVar5;
  string *elem;
  Rep *pRVar6;
  pointer __pos;
  string *psVar7;
  ulong uVar8;
  LogFinisher local_79;
  LocationRecorder *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  LogMessage local_68;
  
  uVar3 = (this->location_->_has_bits_).has_bits_[0];
  local_78 = this;
  if ((uVar3 & 1) != 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x198);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: !location_->has_leading_comments(): ");
    internal::LogFinisher::operator=(&local_79,pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
    uVar3 = (local_78->location_->_has_bits_).has_bits_[0];
  }
  if ((uVar3 & 2) != 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x199);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: !location_->has_trailing_comments(): ");
    internal::LogFinisher::operator=(&local_79,pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (leading->_M_string_length != 0) {
    pLVar2 = local_78->location_;
    (pLVar2->_has_bits_).has_bits_[0] = (pLVar2->_has_bits_).has_bits_[0] | 1;
    psVar7 = (pLVar2->leading_comments_).ptr_;
    if (psVar7 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&pLVar2->leading_comments_,
                 (string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar7 = (pLVar2->leading_comments_).ptr_;
    }
    std::__cxx11::string::swap((string *)psVar7);
  }
  if (trailing->_M_string_length != 0) {
    pLVar2 = local_78->location_;
    (pLVar2->_has_bits_).has_bits_[0] = (pLVar2->_has_bits_).has_bits_[0] | 2;
    psVar7 = (pLVar2->trailing_comments_).ptr_;
    if (psVar7 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&pLVar2->trailing_comments_,
                 (string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar7 = (pLVar2->trailing_comments_).ptr_;
    }
    std::__cxx11::string::swap((string *)psVar7);
  }
  __pos = (detached_comments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((detached_comments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != __pos) {
    uVar8 = 0;
    local_70 = detached_comments;
    do {
      pLVar2 = local_78->location_;
      pRVar6 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar6 == (Rep *)0x0) {
        iVar4 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_;
LAB_002cab82:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase,iVar4 + 1);
        pRVar6 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
        iVar4 = pRVar6->allocated_size;
LAB_002cab94:
        pRVar6->allocated_size = iVar4 + 1;
        this_00 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.arena_;
        if (this_00 == (Arena *)0x0) {
          elem = (string *)operator_new(0x20);
          *(string **)elem = elem + 0x10;
          *(long *)(elem + 8) = 0;
          elem[0x10] = (string)0x0;
        }
        else {
          elem = (string *)
                 Arena::AllocateAligned(this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          *(string **)elem = elem + 0x10;
          *(long *)(elem + 8) = 0;
          elem[0x10] = (string)0x0;
          Arena::AddListNode(this_00,elem,internal::arena_destruct_object<std::__cxx11::string>);
          pRVar6 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
        }
        iVar4 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
        (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        pRVar6->elements[iVar4] = elem;
        detached_comments = local_70;
      }
      else {
        iVar1 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
        iVar4 = pRVar6->allocated_size;
        if (iVar4 <= iVar1) {
          if (iVar4 == (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002cab82;
          goto LAB_002cab94;
        }
        (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        elem = (string *)pRVar6->elements[iVar1];
      }
      std::__cxx11::string::swap(elem);
      uVar8 = uVar8 + 1;
      __pos = (detached_comments->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(detached_comments->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)__pos >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(detached_comments,__pos);
  return;
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    string* leading, string* trailing,
    std::vector<string>* detached_comments) const {
  GOOGLE_CHECK(!location_->has_leading_comments());
  GOOGLE_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
  for (int i = 0; i < detached_comments->size(); ++i) {
    location_->add_leading_detached_comments()->swap(
        (*detached_comments)[i]);
  }
  detached_comments->clear();
}